

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRecognizer.cpp
# Opt level: O2

Encodings xercesc_4_0::XMLRecognizer::encodingForName(XMLCh *encName)

{
  int iVar1;
  Encodings EVar2;
  
  EVar2 = Encodings_Max;
  if ((encName != (XMLCh *)XMLUni::fgXMLChEncodingString) &&
     (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgXMLChEncodingString), iVar1 != 0))
  {
    iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF8EncodingString);
    EVar2 = UTF_8;
    if ((iVar1 != 0) &&
       (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF8EncodingString2), iVar1 != 0
       )) {
      iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUSASCIIEncodingString);
      EVar2 = US_ASCII;
      if ((((iVar1 != 0) &&
           (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUSASCIIEncodingString2),
           iVar1 != 0)) &&
          (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUSASCIIEncodingString3),
          iVar1 != 0)) &&
         (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUSASCIIEncodingString4),
         iVar1 != 0)) {
        iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF16LEncodingString);
        EVar2 = UTF_16L;
        if ((iVar1 != 0) &&
           (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF16LEncodingString2),
           iVar1 != 0)) {
          iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF16BEncodingString);
          EVar2 = UTF_16B;
          if ((iVar1 != 0) &&
             (iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF16BEncodingString2),
             iVar1 != 0)) {
            iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUTF16EncodingString);
            if (iVar1 == 0) {
              iVar1 = 6;
            }
            else {
              iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUCS4LEncodingString);
              if (iVar1 == 0) {
                return UCS_4L;
              }
              iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUCS4LEncodingString2);
              if (iVar1 == 0) {
                return UCS_4L;
              }
              iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUCS4BEncodingString);
              if (iVar1 == 0) {
                return UCS_4B;
              }
              iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUCS4BEncodingString2);
              if (iVar1 == 0) {
                return UCS_4B;
              }
              iVar1 = XMLString::compareString(encName,(XMLCh *)XMLUni::fgUCS4EncodingString);
              if (iVar1 != 0) {
                return OtherEncoding;
              }
              iVar1 = 2;
            }
            EVar2 = iVar1 - (uint)XMLPlatformUtils::fgXMLChBigEndian;
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

XMLRecognizer::Encodings
XMLRecognizer::encodingForName(const XMLCh* const encName)
{
    //
    //  Compare the passed string, assume input string is already uppercased,
    //  to the variations that we recognize.
    //
    //  !!NOTE: Note that we don't handle EBCDIC here because we don't handle
    //  that one ourselves. It is allowed to fall into 'other'.
    //
    if (encName == XMLUni::fgXMLChEncodingString ||
        !XMLString::compareString(encName, XMLUni::fgXMLChEncodingString))
    {
        return XMLRecognizer::XERCES_XMLCH;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF8EncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF8EncodingString2))
    {
        return XMLRecognizer::UTF_8;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString2)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString3)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString4))
    {
        return XMLRecognizer::US_ASCII;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16LEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF16LEncodingString2))
    {
        return XMLRecognizer::UTF_16L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16BEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF16BEncodingString2))
    {
        return XMLRecognizer::UTF_16B;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16EncodingString))
    {
        return XMLPlatformUtils::fgXMLChBigEndian?XMLRecognizer::UTF_16B:XMLRecognizer::UTF_16L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4LEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUCS4LEncodingString2))
    {
        return XMLRecognizer::UCS_4L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4BEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUCS4BEncodingString2))
    {
        return XMLRecognizer::UCS_4B;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4EncodingString))
    {
        return XMLPlatformUtils::fgXMLChBigEndian?XMLRecognizer::UCS_4B:XMLRecognizer::UCS_4L;
    }

    // Return 'other' since we don't recognizer it
    return XMLRecognizer::OtherEncoding;
}